

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool __thiscall
tinyusdz::Stage::compute_absolute_prim_path_and_assign_prim_id
          (Stage *this,bool force_assign_prim_id)

{
  pointer pPVar1;
  bool bVar2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  Prim *root;
  pointer prim;
  Path rootPath;
  string local_140;
  string local_120;
  Path local_100;
  
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"/","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  Path::Path(&local_100,&local_140,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  prim = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (prim != pPVar1) {
    do {
      bVar2 = anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
                        (this,prim,&local_100,1,true,force_assign_prim_id,&this->_err);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_00196162;
      }
      prim = prim + 1;
    } while (prim != pPVar1);
  }
  this->_prim_id_dirty = true;
  bVar2 = true;
LAB_00196162:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
    operator_delete(local_100._element._M_dataplus._M_p,
                    local_100._element.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._variant_part_str._M_dataplus._M_p != &local_100._variant_part_str.field_2) {
    operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                    local_100._variant_part_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._variant_selection_part._M_dataplus._M_p !=
      &local_100._variant_selection_part.field_2) {
    operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                    local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
    operator_delete(local_100._variant_part._M_dataplus._M_p,
                    local_100._variant_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
    operator_delete(local_100._prop_part._M_dataplus._M_p,
                    local_100._prop_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
    operator_delete(local_100._prim_part._M_dataplus._M_p,
                    local_100._prim_part.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool Stage::compute_absolute_prim_path_and_assign_prim_id(
    bool force_assign_prim_id) {
  Path rootPath("/", "");
  for (Prim &root : root_prims()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(*this, root, rootPath, 1,
                                          /* assign_prim_id */ true,
                                          force_assign_prim_id, &_err)) {
      return false;
    }
  }

  // TODO: Only set dirty when prim_id changed.
  _prim_id_dirty = true;

  return true;
}